

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall google::protobuf::FieldDescriptor::has_presence(FieldDescriptor *this)

{
  bool bVar1;
  OneofDescriptor *pOVar2;
  
  bVar1 = is_repeated(this);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
    if (((this->type_ & 0xfe) != 10) && ((this->field_0x1 & 8) == 0)) {
      pOVar2 = containing_oneof(this);
      if (pOVar2 == (OneofDescriptor *)0x0) {
        bVar1 = (this->merged_features_->field_0)._impl_.field_presence_ != 2;
      }
    }
  }
  return bVar1;
}

Assistant:

bool FieldDescriptor::has_presence() const {
  if (is_repeated()) return false;
  return cpp_type() == CPPTYPE_MESSAGE || is_extension() ||
         containing_oneof() ||
         features().field_presence() != FeatureSet::IMPLICIT;
}